

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long local_78;
  long lStack_70;
  long local_38;
  long lStack_30;
  
  auVar1._0_8_ = (long)ihi;
  auVar1._8_4_ = ihi;
  auVar1._12_4_ = ihi >> 0x1f;
  auVar2._8_4_ = 0xffffffff;
  auVar2._0_8_ = 0xffffffffffffffff;
  auVar2._12_4_ = 0xffffffff;
  local_38 = (long)jhi + 1;
  lStack_30 = (long)ilo - auVar2._8_8_;
  local_78 = auVar1._0_8_ + 1;
  lStack_70 = auVar1._8_8_ - auVar2._8_8_;
  pnga_print_patch((long)g_a,&local_38,&local_78,(long)pretty);
  return;
}

Assistant:

void GA_Print_patch(int g_a,int ilo,int ihi,int jlo,int jhi,int pretty)
{
    Integer a = (Integer)g_a;
    Integer lo[2];
    Integer hi[2];
    Integer p = (Integer) pretty;
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

    lo[0] = ilo; lo[1] = jlo;
    hi[0] = ihi; lo[1] = jhi;
    COPYINDEX_C2F(lo,_ga_lo,2);
    COPYINDEX_C2F(hi,_ga_hi,2);
    wnga_print_patch(a, _ga_lo, _ga_hi, p);
}